

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int getAutoVacuum(char *z)

{
  uint in_EAX;
  int iVar1;
  uint uVar2;
  int x;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = in_EAX;
  iVar1 = sqlite3StrICmp(z,"none");
  uVar2 = 0;
  if (iVar1 != 0) {
    iVar1 = sqlite3StrICmp(z,"full");
    if (iVar1 == 0) {
      uVar2 = 1;
    }
    else {
      iVar1 = sqlite3StrICmp(z,"incremental");
      if (iVar1 == 0) {
        uVar2 = 2;
      }
      else {
        uStack_18 = (ulong)(uint)uStack_18;
        uVar2 = 0;
        if (z != (char *)0x0) {
          sqlite3GetInt32(z,(int *)((long)&uStack_18 + 4));
          uVar2 = 0;
          if (uStack_18._4_4_ < 3) {
            uVar2 = uStack_18._4_4_;
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int getAutoVacuum(const char *z){
  int i;
  if( 0==sqlite3StrICmp(z, "none") ) return BTREE_AUTOVACUUM_NONE;
  if( 0==sqlite3StrICmp(z, "full") ) return BTREE_AUTOVACUUM_FULL;
  if( 0==sqlite3StrICmp(z, "incremental") ) return BTREE_AUTOVACUUM_INCR;
  i = sqlite3Atoi(z);
  return (u8)((i>=0&&i<=2)?i:0);
}